

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

BeagleImpl * __thiscall
beagle::cpu::BeagleCPUImplFactory<double>::createImpl
          (BeagleCPUImplFactory<double> *this,int tipCount,int partialsBufferCount,
          int compactBufferCount,int stateCount,int patternCount,int eigenBufferCount,
          int matrixBufferCount,int categoryCount,int scaleBufferCount,int resourceNumber,
          int pluginResourceNumber,long preferenceFlags,long requirementFlags,int *errorCode)

{
  undefined1 auVar1 [64];
  int iVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint in_R8D;
  uint in_R9D;
  undefined1 auVar3 [64];
  int *in_stack_00000048;
  BeagleImpl *impl;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  BeagleImpl *local_38;
  
  local_38 = (BeagleImpl *)operator_new(0x178);
  auVar3 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])&local_38[0x13].resourceNumber = auVar1;
  auVar1 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])(local_38 + 0x10) = auVar1;
  auVar1 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])(local_38 + 0xc) = auVar1;
  auVar1 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])(local_38 + 8) = auVar1;
  auVar1 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])(local_38 + 4) = auVar1;
  auVar1 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])local_38 = auVar1;
  BeagleCPUImpl<double,_1,_0>::BeagleCPUImpl
            ((BeagleCPUImpl<double,_1,_0> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  iVar2 = (*local_38->_vptr_BeagleImpl[2])
                    (local_38,(ulong)in_ESI,(ulong)in_EDX,(ulong)in_ECX,(ulong)in_R8D,(ulong)in_R9D)
  ;
  *in_stack_00000048 = iVar2;
  if (*in_stack_00000048 != 0) {
    if (local_38 != (BeagleImpl *)0x0) {
      (*local_38->_vptr_BeagleImpl[1])();
    }
    local_38 = (BeagleImpl *)0x0;
  }
  return local_38;
}

Assistant:

BEAGLE_CPU_FACTORY_TEMPLATE
BeagleImpl* BeagleCPUImplFactory<BEAGLE_CPU_FACTORY_GENERIC>::createImpl(int tipCount,
                                             int partialsBufferCount,
                                             int compactBufferCount,
                                             int stateCount,
                                             int patternCount,
                                             int eigenBufferCount,
                                             int matrixBufferCount,
                                             int categoryCount,
                                             int scaleBufferCount,
                                             int resourceNumber,
                                             int pluginResourceNumber,
                                             long preferenceFlags,
                                             long requirementFlags,
                                             int* errorCode) {

    BeagleImpl* impl = new BeagleCPUImpl<REALTYPE, T_PAD_DEFAULT, P_PAD_DEFAULT>();

    try {
        *errorCode =
            impl->createInstance(tipCount, partialsBufferCount, compactBufferCount, stateCount,
                                 patternCount, eigenBufferCount, matrixBufferCount,
                                 categoryCount,scaleBufferCount, resourceNumber,
                                 pluginResourceNumber,
                                 preferenceFlags, requirementFlags);
        if (*errorCode == BEAGLE_SUCCESS) {
            return impl;
        }
        delete impl;
        return NULL;
    }
    catch(...) {
        if (DEBUGGING_OUTPUT)
            std::cerr << "exception in initialize\n";
        delete impl;
        throw;
    }

    delete impl;

    return NULL;
}